

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O0

string * med3func(string *a,string *b,string *c,int depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  string *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  int vc;
  int vb;
  int va;
  int depth_local;
  string *c_local;
  string *b_local;
  string *a_local;
  
  bVar1 = (*a)[depth];
  bVar2 = (*b)[depth];
  a_local = a;
  if (((bVar1 != bVar2) && (bVar3 = (*c)[depth], a_local = c, bVar3 != bVar1)) && (bVar3 != bVar2))
  {
    if (bVar1 < bVar2) {
      local_40 = b;
      if (bVar3 <= bVar2) {
        local_48 = a;
        if (bVar1 < bVar3) {
          local_48 = c;
        }
        local_40 = local_48;
      }
      local_50 = local_40;
    }
    else {
      local_58 = b;
      if (bVar2 <= bVar3) {
        local_60 = c;
        if (bVar1 < bVar3) {
          local_60 = a;
        }
        local_58 = local_60;
      }
      local_50 = local_58;
    }
    a_local = local_50;
  }
  return a_local;
}

Assistant:

static string *med3func(string *a, string *b, string *c, int depth)
{   int va, vb, vc;
    if ((va=ptr2char(a)) == (vb=ptr2char(b)))
        return a;
    if ((vc=ptr2char(c)) == va || vc == vb)
        return c;       
    return va < vb ?
          (vb < vc ? b : (va < vc ? c : a ) )
        : (vb > vc ? b : (va < vc ? a : c ) );
}